

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::CropResizeLayerParams::CropResizeLayerParams
          (CropResizeLayerParams *this,CropResizeLayerParams *from)

{
  int new_size;
  void *pvVar1;
  SamplingMode *from_00;
  BoxCoordinatesMode *from_01;
  undefined3 uVar2;
  float fVar3;
  SamplingMode *this_00;
  BoxCoordinatesMode *this_01;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__CropResizeLayerParams_00724ea0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->targetsize_).current_size_ = 0;
  (this->targetsize_).total_size_ = 0;
  (this->targetsize_).rep_ = (Rep *)0x0;
  new_size = (from->targetsize_).current_size_;
  if (new_size != 0) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&this->targetsize_,new_size);
    memcpy(((this->targetsize_).rep_)->elements,((from->targetsize_).rep_)->elements,
           (long)(from->targetsize_).current_size_ << 3);
    (this->targetsize_).current_size_ = (from->targetsize_).current_size_;
  }
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  from_00 = from->mode_;
  if (from_00 == (SamplingMode *)0x0 ||
      from == (CropResizeLayerParams *)&_CropResizeLayerParams_default_instance_) {
    this_00 = (SamplingMode *)0x0;
  }
  else {
    this_00 = (SamplingMode *)operator_new(0x18);
    SamplingMode::SamplingMode(this_00,from_00);
  }
  this->mode_ = this_00;
  from_01 = from->boxindicesmode_;
  if (from_01 == (BoxCoordinatesMode *)0x0 ||
      from == (CropResizeLayerParams *)&_CropResizeLayerParams_default_instance_) {
    this_01 = (BoxCoordinatesMode *)0x0;
  }
  else {
    this_01 = (BoxCoordinatesMode *)operator_new(0x18);
    BoxCoordinatesMode::BoxCoordinatesMode(this_01,from_01);
  }
  this->boxindicesmode_ = this_01;
  uVar2 = *(undefined3 *)&from->field_0x39;
  fVar3 = from->spatialscale_;
  this->normalizedcoordinates_ = from->normalizedcoordinates_;
  *(undefined3 *)&this->field_0x39 = uVar2;
  this->spatialscale_ = fVar3;
  return;
}

Assistant:

CropResizeLayerParams::CropResizeLayerParams(const CropResizeLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      targetsize_(from.targetsize_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_mode()) {
    mode_ = new ::CoreML::Specification::SamplingMode(*from.mode_);
  } else {
    mode_ = NULL;
  }
  if (from.has_boxindicesmode()) {
    boxindicesmode_ = new ::CoreML::Specification::BoxCoordinatesMode(*from.boxindicesmode_);
  } else {
    boxindicesmode_ = NULL;
  }
  ::memcpy(&normalizedcoordinates_, &from.normalizedcoordinates_,
    reinterpret_cast<char*>(&spatialscale_) -
    reinterpret_cast<char*>(&normalizedcoordinates_) + sizeof(spatialscale_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.CropResizeLayerParams)
}